

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

void fdb_kvs_header_create(filemgr *file)

{
  if (file->kv_header != (kvs_header *)0x0) {
    return;
  }
  _fdb_kvs_header_create(&file->kv_header);
  file->free_kv_header = fdb_kvs_header_free;
  return;
}

Assistant:

void _fdb_kvs_header_create(struct kvs_header **kv_header_ptr)
{
    struct kvs_header *kv_header;

    kv_header = (struct kvs_header *)calloc(1, sizeof(struct kvs_header));
    *kv_header_ptr = kv_header;

    // KV ID '0' is reserved for default KV instance (super handle)
    kv_header->id_counter = 1;
    kv_header->default_kvs_cmp = NULL;
    kv_header->default_kvs_cmp_param = NULL;
    kv_header->custom_cmp_enabled = 0;
    kv_header->idx_name = (struct avl_tree*)malloc(sizeof(struct avl_tree));
    kv_header->idx_id = (struct avl_tree*)malloc(sizeof(struct avl_tree));
    kv_header->num_kv_stores = 0;
    avl_init(kv_header->idx_name, NULL);
    avl_init(kv_header->idx_id, NULL);
    spin_init(&kv_header->lock);
}